

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

bool amrex::is_integer(char *str)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  if (str == (char *)0x0) {
    bVar5 = false;
  }
  else {
    sVar3 = strlen(str);
    uVar2 = (uint)sVar3;
    if (uVar2 == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = (int)uVar2 < 1;
      if ((0 < (int)uVar2) && ((int)*str - 0x30U < 10)) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if ((uVar2 & 0x7fffffff) == uVar4) break;
          uVar1 = uVar4 + 1;
        } while ((int)str[uVar4] - 0x30U < 10);
        bVar5 = (uVar2 & 0x7fffffff) <= uVar4;
      }
    }
  }
  return bVar5;
}

Assistant:

bool
amrex::is_integer (const char* str)
{
    int len = 0;

    if (str == 0 || (len = strlen(str)) == 0)
        return false;

    for (int i = 0; i < len; i++)
        if (!isdigit(str[i]))
            return false;

    return true;
}